

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void Test_TemplateModifiers_UrlQueryEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  int iVar15;
  char *pcVar16;
  TemplateDictionaryPeer peer;
  TemplateString local_258;
  TemplateString local_238;
  TemplateString local_218;
  TemplateString local_1f8;
  TemplateString local_1d8;
  TemplateString local_1b8;
  TemplateString local_198;
  TemplateString local_178;
  TemplateString local_158;
  TemplateString local_138;
  TemplateString local_118;
  TemplateString local_f8;
  TemplateString local_d8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_258,"TestUrlQueryEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_258,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_98,"query escape 0");
  ctemplate::TemplateString::TemplateString(&local_b8,"");
  TVar1.length_ = local_98.length_;
  TVar1.ptr_ = local_98.ptr_;
  TVar1.is_immutable_ = local_98.is_immutable_;
  TVar1._17_7_ = local_98._17_7_;
  TVar1.id_ = local_98.id_;
  TVar8.length_ = local_b8.length_;
  TVar8.ptr_ = local_b8.ptr_;
  TVar8.is_immutable_ = local_b8.is_immutable_;
  TVar8._17_7_ = local_b8._17_7_;
  TVar8.id_ = local_b8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar8,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_d8,"query escape 1");
  ctemplate::TemplateString::TemplateString(&local_f8,"noop");
  TVar2.length_ = local_d8.length_;
  TVar2.ptr_ = local_d8.ptr_;
  TVar2.is_immutable_ = local_d8.is_immutable_;
  TVar2._17_7_ = local_d8._17_7_;
  TVar2.id_ = local_d8.id_;
  TVar9.length_ = local_f8.length_;
  TVar9.ptr_ = local_f8.ptr_;
  TVar9.is_immutable_ = local_f8.is_immutable_;
  TVar9._17_7_ = local_f8._17_7_;
  TVar9.id_ = local_f8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar9,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_118,"query escape 2");
  ctemplate::TemplateString::TemplateString
            (&local_138,"0123456789abcdefghjijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ.-_*/~!(),")
  ;
  TVar3.length_ = local_118.length_;
  TVar3.ptr_ = local_118.ptr_;
  TVar3.is_immutable_ = local_118.is_immutable_;
  TVar3._17_7_ = local_118._17_7_;
  TVar3.id_ = local_118.id_;
  TVar10.length_ = local_138.length_;
  TVar10.ptr_ = local_138.ptr_;
  TVar10.is_immutable_ = local_138.is_immutable_;
  TVar10._17_7_ = local_138._17_7_;
  TVar10.id_ = local_138.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar10,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_158,"query escape 3");
  ctemplate::TemplateString::TemplateString(&local_178," ?a=b;c#d ");
  TVar4.length_ = local_158.length_;
  TVar4.ptr_ = local_158.ptr_;
  TVar4.is_immutable_ = local_158.is_immutable_;
  TVar4._17_7_ = local_158._17_7_;
  TVar4.id_ = local_158.id_;
  TVar11.length_ = local_178.length_;
  TVar11.ptr_ = local_178.ptr_;
  TVar11.is_immutable_ = local_178.is_immutable_;
  TVar11._17_7_ = local_178._17_7_;
  TVar11.id_ = local_178.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar11,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_198,"query escape 4");
  ctemplate::TemplateString::TemplateString(&local_1b8,"#$%&+<=>?@[\\]^`{|}");
  TVar5.length_ = local_198.length_;
  TVar5.ptr_ = local_198.ptr_;
  TVar5.is_immutable_ = local_198.is_immutable_;
  TVar5._17_7_ = local_198._17_7_;
  TVar5.id_ = local_198.id_;
  TVar12.length_ = local_1b8.length_;
  TVar12.ptr_ = local_1b8.ptr_;
  TVar12.is_immutable_ = local_1b8.is_immutable_;
  TVar12._17_7_ = local_1b8._17_7_;
  TVar12.id_ = local_1b8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar12,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_1d8,"query escape 5");
  ctemplate::TemplateString::TemplateString(&local_1f8,anon_var_dwarf_527b);
  TVar6.length_ = local_1d8.length_;
  TVar6.ptr_ = local_1d8.ptr_;
  TVar6.is_immutable_ = local_1d8.is_immutable_;
  TVar6._17_7_ = local_1d8._17_7_;
  TVar6.id_ = local_1d8.id_;
  TVar13.length_ = local_1f8.length_;
  TVar13.ptr_ = local_1f8.ptr_;
  TVar13.is_immutable_ = local_1f8.is_immutable_;
  TVar13._17_7_ = local_1f8._17_7_;
  TVar13.id_ = local_1f8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar6,TVar13,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_218,"query escape 6");
  ctemplate::TemplateString::TemplateString(&local_238,"\"\':");
  TVar7.length_ = local_218.length_;
  TVar7.ptr_ = local_218.ptr_;
  TVar7.is_immutable_ = local_218.is_immutable_;
  TVar7._17_7_ = local_218._17_7_;
  TVar7.id_ = local_218.id_;
  TVar14.length_ = local_238.length_;
  TVar14.ptr_ = local_238.ptr_;
  TVar14.is_immutable_ = local_238.is_immutable_;
  TVar14._17_7_ = local_238._17_7_;
  TVar14.id_ = local_238.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar7,TVar14,(TemplateModifier *)&dict);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_258,"query escape 0");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
  if (*pcVar16 == '\0') {
    ctemplate::TemplateString::TemplateString(&local_258,"query escape 1");
    pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
    iVar15 = strcmp(pcVar16,"noop");
    if (iVar15 == 0) {
      ctemplate::TemplateString::TemplateString(&local_258,"query escape 2");
      pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
      iVar15 = strcmp(pcVar16,
                      "0123456789abcdefghjijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ.-_*/~!(),");
      if (iVar15 == 0) {
        ctemplate::TemplateString::TemplateString(&local_258,"query escape 3");
        pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
        iVar15 = strcmp(pcVar16,"+%3Fa%3Db%3Bc%23d+");
        if (iVar15 == 0) {
          ctemplate::TemplateString::TemplateString(&local_258,"query escape 4");
          pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
          iVar15 = strcmp(pcVar16,"%23%24%25%26%2B%3C%3D%3E%3F%40%5B%5C%5D%5E%60%7B%7C%7D");
          if (iVar15 == 0) {
            ctemplate::TemplateString::TemplateString(&local_258,"query escape 5");
            pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
            iVar15 = strcmp(pcVar16,"%DE%AD%CA%FE");
            if (iVar15 == 0) {
              ctemplate::TemplateString::TemplateString(&local_258,"query escape 6");
              pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
              iVar15 = strcmp(pcVar16,"%22%27%3A");
              if (iVar15 == 0) {
                ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
                return;
              }
              pcVar16 = "strcmp(peer.GetSectionValue(\"query escape 6\"), \"%22%27%3A\") == 0";
            }
            else {
              pcVar16 = "strcmp(peer.GetSectionValue(\"query escape 5\"), \"%DE%AD%CA%FE\") == 0";
            }
          }
          else {
            pcVar16 = 
            "strcmp(peer.GetSectionValue(\"query escape 4\"), \"%23%24%25%26%2B%3C%3D%3E%3F%40%5B%5C%5D%5E%60%7B%7C%7D\") == 0"
            ;
          }
        }
        else {
          pcVar16 = "strcmp(peer.GetSectionValue(\"query escape 3\"), \"+%3Fa%3Db%3Bc%23d+\") == 0";
        }
      }
      else {
        pcVar16 = 
        "strcmp(peer.GetSectionValue(\"query escape 2\"), \"0123456789abcdefghjijklmnopqrstuvwxyz\" \"ABCDEFGHIJKLMNOPQRSTUVWXYZ.-_*/~!(),\") == 0"
        ;
      }
    }
    else {
      pcVar16 = "strcmp(peer.GetSectionValue(\"query escape 1\"), \"noop\") == 0";
    }
  }
  else {
    pcVar16 = "strcmp(peer.GetSectionValue(\"query escape 0\"), \"\") == 0";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar16);
  exit(1);
}

Assistant:

TEST(TemplateModifiers, UrlQueryEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestUrlQueryEscape", NULL);
  // The first three tests do not need escaping.
  dict.SetEscapedValue("query escape 0", "",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 1", "noop",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 2",
                       "0123456789abcdefghjijklmnopqrstuvwxyz"
                       "ABCDEFGHIJKLMNOPQRSTUVWXYZ.-_*/~!(),",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 3", " ?a=b;c#d ",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 4", "#$%&+<=>?@[\\]^`{|}",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 5", "\xDE\xAD\xCA\xFE",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 6", "\"':",
                       GOOGLE_NAMESPACE::url_query_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("query escape 0"), "");
  EXPECT_STREQ(peer.GetSectionValue("query escape 1"), "noop");
  EXPECT_STREQ(peer.GetSectionValue("query escape 2"),
               "0123456789abcdefghjijklmnopqrstuvwxyz"
               "ABCDEFGHIJKLMNOPQRSTUVWXYZ.-_*/~!(),");
  EXPECT_STREQ(peer.GetSectionValue("query escape 3"), "+%3Fa%3Db%3Bc%23d+");
  EXPECT_STREQ(peer.GetSectionValue("query escape 4"),
               "%23%24%25%26%2B%3C%3D%3E%3F%40%5B%5C%5D%5E%60%7B%7C%7D");
  EXPECT_STREQ(peer.GetSectionValue("query escape 5"), "%DE%AD%CA%FE");
  EXPECT_STREQ(peer.GetSectionValue("query escape 6"), "%22%27%3A");
}